

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZEqnArray<float>_>::TPZVec
          (TPZVec<TPZEqnArray<float>_> *this,TPZVec<TPZEqnArray<float>_> *rval)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  int64_t i;
  TPZEqnArray<float> *this_00;
  long lVar6;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_017c3588;
  uVar1 = rval->fNElements;
  this->fNElements = uVar1;
  lVar4 = rval->fNAlloc;
  if (lVar4 == 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x22f0),8) == 0) {
      uVar5 = SUB168(auVar2 * ZEXT816(0x22f0),0) | 8;
    }
    puVar3 = (ulong *)operator_new__(uVar5);
    *puVar3 = uVar1;
    if (uVar1 != 0) {
      lVar4 = 0;
      this_00 = (TPZEqnArray<float> *)(puVar3 + 1);
      do {
        TPZEqnArray<float>::TPZEqnArray(this_00);
        lVar4 = lVar4 + -0x22f0;
        this_00 = this_00 + 1;
      } while (uVar1 * -0x22f0 - lVar4 != 0);
    }
    this->fStore = (TPZEqnArray<float> *)(puVar3 + 1);
    lVar6 = 0;
    for (lVar4 = 0; lVar4 < this->fNElements; lVar4 = lVar4 + 1) {
      TPZEqnArray<float>::operator=
                ((TPZEqnArray<float> *)
                 ((long)(this->fStore->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                 lVar6 + -0x28),
                 (TPZEqnArray<float> *)
                 ((long)(rval->fStore->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                 lVar6 + -0x28));
      lVar6 = lVar6 + 0x22f0;
    }
  }
  else {
    this->fStore = rval->fStore;
    this->fNAlloc = lVar4;
    rval->fStore = (TPZEqnArray<float> *)0x0;
    rval->fNAlloc = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}